

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O2

int arm_debug_target_el(CPUARMState_conflict *env)

{
  ulong uVar1;
  _Bool _Var2;
  int iVar3;
  
  _Var2 = arm_is_secure(env);
  uVar1 = env->features;
  if (((uVar1 >> 0x20 & 1) == 0 || _Var2) ||
     ((iVar3 = 2, ((env->cp15).hcr_el2 & 0x8000000) == 0 && (((env->cp15).mdcr_el2 & 0x100) == 0))))
  {
    if (((uVar1 >> 0x21 & 1) == 0) || (((uint)uVar1 >> 0x1c & 1) != 0 || !_Var2)) {
      iVar3 = 1;
    }
    else {
      iVar3 = 3;
    }
  }
  return iVar3;
}

Assistant:

static inline int arm_debug_target_el(CPUARMState *env)
{
    bool secure = arm_is_secure(env);
    bool route_to_el2 = false;

    if (arm_feature(env, ARM_FEATURE_EL2) && !secure) {
        route_to_el2 = env->cp15.hcr_el2 & HCR_TGE ||
                       env->cp15.mdcr_el2 & MDCR_TDE;
    }

    if (route_to_el2) {
        return 2;
    } else if (arm_feature(env, ARM_FEATURE_EL3) &&
               !arm_el_is_aa64(env, 3) && secure) {
        return 3;
    } else {
        return 1;
    }
}